

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkShow6VarFunc(char *pF0,char *pF1)

{
  size_t sVar1;
  word local_28;
  word F1;
  word F0;
  char *pF1_local;
  char *pF0_local;
  
  F0 = (word)pF1;
  pF1_local = pF0;
  sVar1 = strlen(pF0);
  if (sVar1 == 0x10) {
    sVar1 = strlen((char *)F0);
    if (sVar1 == 0x10) {
      Extra_ReadHexadecimal((uint *)&F1,pF1_local,6);
      Extra_ReadHexadecimal((uint *)&local_28,(char *)F0,6);
      Abc_Show6VarFunc(F1,local_28);
    }
    else {
      sVar1 = strlen((char *)F0);
      printf("Wrong length (%d) of 6-var truth table.\n",sVar1 & 0xffffffff);
    }
  }
  else {
    sVar1 = strlen(pF1_local);
    printf("Wrong length (%d) of 6-var truth table.\n",sVar1 & 0xffffffff);
  }
  return;
}

Assistant:

void Abc_NtkShow6VarFunc( char * pF0, char * pF1 )
{
    word F0, F1;
    if ( strlen(pF0) != 16 )
    {
        printf( "Wrong length (%d) of 6-var truth table.\n", (int)strlen(pF0) );
        return;
    }
    if ( strlen(pF1) != 16 )
    {
        printf( "Wrong length (%d) of 6-var truth table.\n", (int)strlen(pF1) );
        return;
    }
    Extra_ReadHexadecimal( (unsigned *)&F0, pF0, 6 );
    Extra_ReadHexadecimal( (unsigned *)&F1, pF1, 6 );
    Abc_Show6VarFunc( F0, F1 );
}